

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_math.h
# Opt level: O0

Mat4x4 * __thiscall phyr::_Mat4x4::operator*(_Mat4x4 *this,Mat4x4 *m)

{
  long in_RDX;
  long in_RSI;
  _Mat4x4 *in_RDI;
  int j;
  int i;
  int local_18;
  int local_14;
  
  _Mat4x4(in_RDI);
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      in_RDI->d[local_14][local_18] =
           *(double *)(in_RSI + (long)local_14 * 0x20 + 0x18) *
           *(double *)(in_RDX + 0x60 + (long)local_18 * 8) +
           *(double *)(in_RSI + (long)local_14 * 0x20 + 0x10) *
           *(double *)(in_RDX + 0x40 + (long)local_18 * 8) +
           *(double *)(in_RSI + (long)local_14 * 0x20) * *(double *)(in_RDX + (long)local_18 * 8) +
           *(double *)(in_RSI + (long)local_14 * 0x20 + 8) *
           *(double *)(in_RDX + 0x20 + (long)local_18 * 8);
    }
  }
  return in_RDI;
}

Assistant:

inline Mat4x4 operator*(const Mat4x4& m) const {
        Mat4x4 _m;
        for (int i = 0; i < 4; ++i)
            for (int j = 0; j < 4; ++j)
                _m.d[i][j] = d[i][0] * m.d[0][j] + d[i][1] * m.d[1][j] +
                             d[i][2] * m.d[2][j] + d[i][3] * m.d[3][j];
        return _m;
    }